

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined8 uVar1;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  undefined1 auVar2 [8];
  size_t sVar3;
  byte bVar4;
  bool bVar5;
  _Ios_Iostate _Var6;
  _Ios_Openmode _Var7;
  openmode __mode;
  uint compressed_length;
  const_reference pvVar8;
  const_iterator pvVar9;
  __sv_type __y;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_5b0;
  failure *fail;
  _List *local_598;
  bool *local_590;
  ofstream *local_588;
  size_t *local_580;
  undefined1 local_571;
  long lStack_570;
  bool success;
  ifstream in_file;
  long local_368;
  ofstream out_file;
  value_type *current_mode;
  const_iterator __end6;
  const_iterator __begin6;
  array<Mode,_12UL> *__range6;
  size_t local_118;
  char *local_110;
  ulong local_108;
  unsigned_long result;
  char *end;
  size_type argument_position;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e0;
  size_t local_d0;
  char *local_c8;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_c0;
  size_t local_b0;
  char *local_a8;
  undefined1 local_a0 [8];
  string_view arg;
  ulong uStack_88;
  int i;
  size_t module_size;
  undefined1 local_78 [6];
  bool decompress;
  bool moduled;
  path out_filename;
  path in_filename;
  Mode *mode;
  int exit_code;
  char **argv_local;
  int argc_local;
  
  mode._4_4_ = 0;
  in_filename._M_cmpts = (_List)0x0;
  in_filename._33_7_ = 0;
  std::filesystem::__cxx11::path::path((path *)&out_filename._M_cmpts);
  std::filesystem::__cxx11::path::path((path *)local_78);
  module_size._7_1_ = 0;
  module_size._6_1_ = 0;
  uStack_88 = 0x1000;
  arg._M_str._4_4_ = 0;
LAB_00104a09:
  if (argc + -1 <= arg._M_str._4_4_) {
LAB_00104d8d:
    if (mode._4_4_ != 1) {
      bVar5 = std::filesystem::__cxx11::path::empty((path *)&out_filename._M_cmpts);
      if (bVar5) {
        mode._4_4_ = 1;
        std::operator<<((ostream *)&std::cerr,"Error: Input file not specified\n");
        PrintUsage();
      }
      else if (in_filename._32_8_ == 0) {
        mode._4_4_ = 1;
        std::operator<<((ostream *)&std::cerr,"Error: Format not specified\n");
        PrintUsage();
      }
      else {
        bVar5 = std::filesystem::__cxx11::path::empty((path *)local_78);
        if (bVar5) {
          if ((module_size._7_1_ & 1) == 0) {
            local_5b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (in_filename._32_8_ + 0x28);
          }
          else {
            local_5b0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (in_filename._32_8_ + 0x48);
          }
          std::filesystem::__cxx11::path::operator=((path *)local_78,local_5b0);
        }
        std::ofstream::ofstream(&local_368);
        uVar1 = *(undefined8 *)(local_368 + -0x18);
        _Var6 = std::operator|(_S_badbit,_S_eofbit);
        std::operator|(_Var6,_S_failbit);
        std::ios::exceptions((int)&local_368 + (int)uVar1);
        bVar4 = module_size._6_1_;
        _Var7 = std::operator|(_S_trunc,_S_in);
        _Var7 = std::operator|(_Var7,_S_out);
        _Var7 = std::operator|(_Var7,_S_bin);
        __mode = std::operator|(_S_out,_S_bin);
        if ((bVar4 & 1) != 0) {
          __mode = _Var7;
        }
        std::basic_ofstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                  ((basic_ofstream<char,_std::char_traits<char>_> *)&local_368,(path *)local_78,
                   __mode);
        if ((module_size._6_1_ & 1) == 0) {
          fail = (failure *)&out_filename._M_cmpts;
          local_598 = &in_filename._M_cmpts;
          local_590 = (bool *)((long)&module_size + 7);
          local_588 = (ofstream *)&local_368;
          local_580 = &stack0xffffffffffffff78;
          local_571 = main::anon_class_40_5_1f1a808d::operator()((anon_class_40_5_1f1a808d *)&fail);
          if (!(bool)local_571) {
            mode._4_4_ = 1;
            std::operator<<((ostream *)&std::cerr,"Error: File could not be compressed\n");
          }
        }
        else {
          std::ifstream::ifstream(&stack0xfffffffffffffa90);
          uVar1 = *(undefined8 *)(lStack_570 + -0x18);
          _Var6 = std::operator|(_S_badbit,_S_eofbit);
          std::operator|(_Var6,_S_failbit);
          std::ios::exceptions((int)&stack0xfffffffffffffa90 + (int)uVar1);
          _Var7 = std::operator|(_S_in,_S_bin);
          std::basic_ifstream<char,_std::char_traits<char>_>::open<std::filesystem::__cxx11::path>
                    ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                     (path *)&out_filename._M_cmpts,_Var7);
          switch(*(undefined4 *)(in_filename._32_8_ + 0x20)) {
          case 0:
            if ((module_size._7_1_ & 1) == 0) {
              ClownLZSS::ChameleonDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            else {
              ClownLZSS::ModuledChameleonDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            break;
          case 1:
            if ((module_size._7_1_ & 1) == 0) {
              ClownLZSS::ComperDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            else {
              ClownLZSS::ModuledComperDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            break;
          case 2:
            if ((module_size._7_1_ & 1) == 0) {
              ClownLZSS::EnigmaDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            else {
              ClownLZSS::ModuledEnigmaDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            break;
          case 3:
            if ((module_size._7_1_ & 1) == 0) {
              ClownLZSS::FaxmanDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            else {
              ClownLZSS::ModuledFaxmanDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            break;
          case 4:
          case 5:
            if ((module_size._7_1_ & 1) == 0) {
              ClownLZSS::GbaDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            else {
              ClownLZSS::ModuledGbaDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            break;
          case 6:
            if ((module_size._7_1_ & 1) == 0) {
              ClownLZSS::KosinskiDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            else {
              ClownLZSS::ModuledKosinskiDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            break;
          case 7:
            if ((module_size._7_1_ & 1) == 0) {
              ClownLZSS::KosinskiPlusDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            else {
              ClownLZSS::ModuledKosinskiPlusDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            break;
          case 8:
            if ((module_size._7_1_ & 1) == 0) {
              ClownLZSS::RageDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            else {
              ClownLZSS::ModuledRageDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            break;
          case 9:
            if ((module_size._7_1_ & 1) == 0) {
              ClownLZSS::RocketDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            else {
              ClownLZSS::ModuledRocketDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            break;
          case 10:
            if ((module_size._7_1_ & 1) == 0) {
              ClownLZSS::SaxmanDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            else {
              ClownLZSS::ModuledSaxmanDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
            break;
          case 0xb:
            if ((module_size._7_1_ & 1) == 0) {
              compressed_length = std::filesystem::file_size((path *)&out_filename._M_cmpts);
              ClownLZSS::SaxmanDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368,
                         compressed_length);
            }
            else {
              ClownLZSS::ModuledSaxmanDecompress<std::ifstream&,std::ofstream&>
                        ((basic_ifstream<char,_std::char_traits<char>_> *)&stack0xfffffffffffffa90,
                         (basic_ofstream<char,_std::char_traits<char>_> *)&local_368);
            }
          }
          std::ifstream::~ifstream(&stack0xfffffffffffffa90);
        }
        std::ofstream::~ofstream(&local_368);
      }
    }
    std::filesystem::__cxx11::path::~path((path *)local_78);
    std::filesystem::__cxx11::path::~path((path *)&out_filename._M_cmpts);
    return mode._4_4_;
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_a0,
             argv[(long)arg._M_str._4_4_ + 1]);
  pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_a0,0);
  if (*pvVar8 == '-') {
    local_b0 = (size_t)local_a0;
    local_a8 = (char *)arg._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_c0,"-h");
    __x_02._M_str = local_a8;
    __x_02._M_len = local_b0;
    bVar5 = std::operator==(__x_02,local_c0);
    if (!bVar5) {
      local_d0 = (size_t)local_a0;
      local_c8 = (char *)arg._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e0,"--help");
      __x_01._M_str = local_c8;
      __x_01._M_len = local_d0;
      bVar5 = std::operator==(__x_01,local_e0);
      if (!bVar5) {
        pvVar8 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                           ((basic_string_view<char,_std::char_traits<char>_> *)local_a0,1);
        if (*pvVar8 == 'm') {
          module_size._7_1_ = 1;
          end = (char *)std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                                  ((basic_string_view<char,_std::char_traits<char>_> *)local_a0,'=',
                                   0);
          if (end == (char *)0xffffffffffffffff) goto LAB_00104d77;
          local_108 = strtoul(argv[(long)arg._M_str._4_4_ + 1] + (long)(end + 1),(char **)&result,0)
          ;
          if (*(char *)result != '\0') {
            std::operator<<((ostream *)&std::cerr,"Invalid parameter to -m\n");
            mode._4_4_ = 1;
            goto LAB_00104d8d;
          }
          uStack_88 = local_108;
          if (0x1000 < local_108) {
            std::operator<<((ostream *)&std::cerr,
                            "Warning: the moduled format header does not fully support sizes greater than\n 0x1000 - header will likely be invalid!\n"
                           );
          }
        }
        else {
          local_118 = (size_t)local_a0;
          local_110 = (char *)arg._M_len;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)&__range6,"-d");
          __x_00._M_str = local_110;
          __x_00._M_len = local_118;
          bVar5 = std::operator==(__x_00,___range6);
          if (bVar5) {
            module_size._6_1_ = 1;
          }
          else {
            __end6 = std::array<Mode,_12UL>::begin(&modes);
            pvVar9 = std::array<Mode,_12UL>::end(&modes);
            for (; sVar3 = arg._M_len, auVar2 = local_a0, __end6 != pvVar9; __end6 = __end6 + 1) {
              __y = std::__cxx11::string::operator_cast_to_basic_string_view((string *)__end6);
              __x._M_str = (char *)sVar3;
              __x._M_len = (size_t)auVar2;
              bVar5 = std::operator==(__x,__y);
              if (bVar5) {
                in_filename._32_8_ = __end6;
                break;
              }
            }
          }
        }
        goto LAB_00104d77;
      }
    }
    PrintUsage();
  }
  else {
    bVar5 = std::filesystem::__cxx11::path::empty((path *)&out_filename._M_cmpts);
    if (bVar5) {
      std::filesystem::__cxx11::path::operator=
                ((path *)&out_filename._M_cmpts,
                 (basic_string_view<char,_std::char_traits<char>_> *)local_a0);
    }
    else {
      std::filesystem::__cxx11::path::operator=
                ((path *)local_78,(basic_string_view<char,_std::char_traits<char>_> *)local_a0);
    }
  }
LAB_00104d77:
  arg._M_str._4_4_ = arg._M_str._4_4_ + 1;
  goto LAB_00104a09;
}

Assistant:

int main(int argc, char **argv)
{
	int exit_code = EXIT_SUCCESS;

	const Mode *mode = NULL;
	std::filesystem::path in_filename;
	std::filesystem::path out_filename;
	bool moduled = false, decompress = false;
	std::size_t module_size = 0x1000;

	/* Skip past the executable name */
	--argc;
	++argv;

	/* Parse arguments */
	for (int i = 0; i < argc; ++i)
	{
		const std::string_view arg(argv[i]);

		if (arg[0] == '-')
		{
			if (arg == "-h" || arg == "--help")
			{
				PrintUsage();
			}
			else if (arg[1] == 'm')
			{
				moduled = true;

				const auto argument_position = arg.find_first_of('=');

				if (argument_position != arg.npos)
				{
					char *end;
					unsigned long result = std::strtoul(&argv[i][argument_position + 1], &end, 0);

					if (*end != '\0')
					{
						std::cerr << "Invalid parameter to -m\n";
						exit_code = EXIT_FAILURE;
						break;
					}
					else
					{
						module_size = result;

						if (module_size > 0x1000)
							std::cerr << "Warning: the moduled format header does not fully support sizes greater than\n 0x1000 - header will likely be invalid!\n";
					}
				}
			}
			else if (arg == "-d")
			{
				decompress = true;
			}
			else
			{
				for (const auto &current_mode : modes)
				{
					if (arg == current_mode.command)
					{
						mode = &current_mode;
						break;
					}
				}
			}
		}
		else
		{
			if (in_filename.empty())
				in_filename = arg;
			else
				out_filename = arg;
		}
	}

	if (exit_code != EXIT_FAILURE)
	{
		if (in_filename.empty())
		{
			exit_code = EXIT_FAILURE;
			std::cerr << "Error: Input file not specified\n";
			PrintUsage();
		}
		else if (mode == NULL)
		{
			exit_code = EXIT_FAILURE;
			std::cerr << "Error: Format not specified\n";
			PrintUsage();
		}
		else
		{
			if (out_filename.empty())
				out_filename = moduled ? mode->moduled_default_filename : mode->normal_default_filename;

			try
			{
				std::ofstream out_file;
				out_file.exceptions(out_file.badbit | out_file.eofbit | out_file.failbit);
				out_file.open(out_filename, decompress ? out_file.trunc | out_file.in | out_file.out | out_file.binary : out_file.out | out_file.binary);

				if (decompress)
				{
					std::ifstream in_file;
					in_file.exceptions(in_file.badbit | in_file.eofbit | in_file.failbit);
					in_file.open(in_filename, in_file.in | in_file.binary);

					switch (mode->format)
					{
						case Format::CHAMELEON:
							if (moduled)
								ClownLZSS::ModuledChameleonDecompress(in_file, out_file);
							else
								ClownLZSS::ChameleonDecompress(in_file, out_file);
							break;

						case Format::COMPER:
							if (moduled)
								ClownLZSS::ModuledComperDecompress(in_file, out_file);
							else
								ClownLZSS::ComperDecompress(in_file, out_file);
							break;

						case Format::ENIGMA:
							if (moduled)
								ClownLZSS::ModuledEnigmaDecompress(in_file, out_file);
							else
								ClownLZSS::EnigmaDecompress(in_file, out_file);
							break;

						case Format::FAXMAN:
							if (moduled)
								ClownLZSS::ModuledFaxmanDecompress(in_file, out_file);
							else
								ClownLZSS::FaxmanDecompress(in_file, out_file);
							break;

						case Format::GBA:
						case Format::GBA_VRAM_SAFE:
							if (moduled)
								ClownLZSS::ModuledGbaDecompress(in_file, out_file);
							else
								ClownLZSS::GbaDecompress(in_file, out_file);
							break;

						case Format::KOSINSKI:
							if (moduled)
								ClownLZSS::ModuledKosinskiDecompress(in_file, out_file);
							else
								ClownLZSS::KosinskiDecompress(in_file, out_file);
							break;

						case Format::KOSINSKIPLUS:
							if (moduled)
								ClownLZSS::ModuledKosinskiPlusDecompress(in_file, out_file);
							else
								ClownLZSS::KosinskiPlusDecompress(in_file, out_file);
							break;

						case Format::RAGE:
							if (moduled)
								ClownLZSS::ModuledRageDecompress(in_file, out_file);
							else
								ClownLZSS::RageDecompress(in_file, out_file);
							break;

						case Format::ROCKET:
							if (moduled)
								ClownLZSS::ModuledRocketDecompress(in_file, out_file);
							else
								ClownLZSS::RocketDecompress(in_file, out_file);
							break;

						case Format::SAXMAN:
							if (moduled)
								ClownLZSS::ModuledSaxmanDecompress(in_file, out_file);
							else
								ClownLZSS::SaxmanDecompress(in_file, out_file);
							break;

						case Format::SAXMAN_NO_HEADER:
							if (moduled)
								ClownLZSS::ModuledSaxmanDecompress(in_file, out_file);
							else
								ClownLZSS::SaxmanDecompress(in_file, out_file, std::filesystem::file_size(in_filename));
							break;
					}
				}
				else
				{
					const bool success = [&]() -> bool
					{
						const auto file_buffer = FileToBuffer(in_filename);

						switch (mode->format)
						{
							case Format::CHAMELEON:
								if (moduled)
									return ClownLZSS::ModuledChameleonCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::ChameleonCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::COMPER:
								if (moduled)
									return ClownLZSS::ModuledComperCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::ComperCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::ENIGMA:
								if (moduled)
									return ClownLZSS::ModuledEnigmaCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::EnigmaCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::FAXMAN:
								if (moduled)
									return ClownLZSS::ModuledFaxmanCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::FaxmanCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::GBA:
								if (moduled)
									return ClownLZSS::ModuledGbaCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::GbaCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::GBA_VRAM_SAFE:
								if (moduled)
									return ClownLZSS::ModuledGbaVramSafeCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::GbaVramSafeCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::KOSINSKI:
								if (moduled)
									return ClownLZSS::ModuledKosinskiCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::KosinskiCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::KOSINSKIPLUS:
								if (moduled)
									return ClownLZSS::ModuledKosinskiPlusCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::KosinskiPlusCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::RAGE:
								if (moduled)
									return ClownLZSS::ModuledRageCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::RageCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::ROCKET:
								if (moduled)
									return ClownLZSS::ModuledRocketCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::RocketCompress(file_buffer.data(), file_buffer.size(), out_file);

							case Format::SAXMAN:
								if (moduled)
									return ClownLZSS::ModuledSaxmanCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::SaxmanCompressWithHeader(file_buffer.data(), file_buffer.size(), out_file);

							case Format::SAXMAN_NO_HEADER:
								if (moduled)
									return ClownLZSS::ModuledSaxmanCompress(file_buffer.data(), file_buffer.size(), out_file, module_size);
								else
									return ClownLZSS::SaxmanCompressWithoutHeader(file_buffer.data(), file_buffer.size(), out_file);
						}

						return false;
					}();

					if (!success)
					{
						exit_code = EXIT_FAILURE;
						std::cerr << "Error: File could not be compressed\n";
					}
				}
			}
			catch (const std::ios_base::failure& fail)
			{
				exit_code = EXIT_FAILURE;
				std::cerr << "Error: File IO failure with description '" << fail.what() << "'\n";
			}
		}
	}

	return exit_code;
}